

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>_>::dispose
          (Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>_> *this)

{
  ReplacerImpl<kj::File> *object;
  ReplacerImpl<kj::File> *ptrCopy;
  Own<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>_> *this_local;
  
  object = this->ptr;
  if (object != (ReplacerImpl<kj::File> *)0x0) {
    this->ptr = (ReplacerImpl<kj::File> *)0x0;
    Disposer::dispose<kj::(anonymous_namespace)::InMemoryDirectory::ReplacerImpl<kj::File>>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }